

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
google::protobuf::compiler::cpp::MessageGenerator::RequiredFieldsBitMask
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          MessageGenerator *this)

{
  uint *puVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  value_type this_00;
  FieldDescriptor **ppFVar5;
  Iterator __begin3;
  Iterator __end3;
  Iterator local_50;
  Iterator local_40;
  
  iVar2 = this->max_has_bit_index_ + 0x1f;
  iVar4 = this->max_has_bit_index_ + 0x3e;
  if (-1 < iVar2) {
    iVar4 = iVar2;
  }
  local_50.idx = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,(long)(iVar4 >> 5),(value_type_conflict3 *)&local_50,
             (allocator_type *)&local_40);
  local_50.descriptor = this->descriptor_;
  local_50.idx = 0;
  local_40.idx = (local_50.descriptor)->field_count_;
  local_40.descriptor = local_50.descriptor;
  while( true ) {
    bVar3 = protobuf::internal::operator==(&local_50,&local_40);
    if (bVar3) break;
    this_00 = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator*
                        (&local_50);
    bVar3 = FieldDescriptor::is_required(this_00);
    if (bVar3) {
      if ((this_00->field_0x1 & 8) == 0) {
        ppFVar5 = &this_00->containing_type_->fields_;
      }
      else if ((this_00->scope_).extension_scope == (Descriptor *)0x0) {
        ppFVar5 = &this_00->file_->extensions_;
      }
      else {
        ppFVar5 = &((this_00->scope_).extension_scope)->extensions_;
      }
      iVar2 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start
              [(int)((ulong)((long)this_00 - (long)*ppFVar5) >> 3) * -0x45d1745d];
      iVar4 = iVar2 + 0x1f;
      if (-1 < iVar2) {
        iVar4 = iVar2;
      }
      puVar1 = (__return_storage_ptr__->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start + (iVar4 >> 5);
      *puVar1 = *puVar1 | 1 << ((byte)iVar2 & 0x1f);
    }
    local_50.idx = local_50.idx + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> MessageGenerator::RequiredFieldsBitMask() const {
  const int array_size = HasBitsSize();
  std::vector<uint32_t> masks(array_size, 0);

  for (auto field : FieldRange(descriptor_)) {
    if (!field->is_required()) {
      continue;
    }

    const int has_bit_index = has_bit_indices_[field->index()];
    masks[has_bit_index / 32] |= static_cast<uint32_t>(1)
                                 << (has_bit_index % 32);
  }
  return masks;
}